

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

void Super_WriteFileHeaderStr(Super_Man_t *pMan,Vec_Str_t *vStr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char pBuffer [1000];
  
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pcVar6 = pMan->pName;
  pcVar7 = Extra_TimeStamp();
  sprintf(pBuffer,"# Supergate library derived for \"%s\" on %s.\n",pcVar6,pcVar7);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pcVar6 = "";
  if (pMan->fSkipInv == 0) {
    pcVar6 = "-s";
  }
  sprintf(pBuffer,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
          (double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->nVarsMax,
          (ulong)(uint)pMan->nLevels,(ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,
          pcVar6,pMan->pName);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum delay         = %10.2f.\n",(double)pMan->tDelayMax);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum area          = %10.2f.\n",(double)pMan->tAreaMax);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  ldexp(1.0,pMan->nMints);
  sprintf(pBuffer,"# The total functions       = %.0f (2^%d).\n",(ulong)(uint)pMan->nMints);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# Generation time           = %10.2f sec.\n",(double)((float)pMan->Time / 1e+06))
  ;
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%s\n",pMan->pName);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%d\n",(ulong)(uint)pMan->nVarsMax);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%d\n",(ulong)(uint)pMan->nGates);
  sVar5 = strlen(pBuffer);
  if (0 < (int)(uint)sVar5) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nSize;
      if (uVar2 == vStr->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar2 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar4);
          }
          else {
            pcVar6 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar6;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar6 = vStr->pArray;
      }
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      pcVar6[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void Super_WriteFileHeaderStr( Super_Man_t * pMan, Vec_Str_t * vStr )
{
    char pBuffer[1000];
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Supergate library derived for \"%s\" on %s.\n", pMan->pName, Extra_TimeStamp() );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n", 
        pMan->nVarsMax, pMan->nLevels, pMan->nGatesMax, pMan->TimeLimit, pMan->tDelayMax, pMan->tAreaMax, (pMan->fSkipInv? "" : "-s"), pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of inputs      = %10d.\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of levels      = %10d.\n", pMan->nLevels );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum delay         = %10.2f.\n", pMan->tDelayMax  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum area          = %10.2f.\n", pMan->tAreaMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum runtime (sec) = %10d.\n", pMan->TimeLimit );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of attempts    = %10d.\n", pMan->nTried  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of supergates  = %10d.\n", pMan->nGates  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of functions   = %10d.\n", pMan->nUnique );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The total functions       = %.0f (2^%d).\n", pow((double)2,pMan->nMints), pMan->nMints );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Generation time           = %10.2f sec.\n", (float)(pMan->Time)/(float)(CLOCKS_PER_SEC) );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%s\n", pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nGates );
    Vec_StrPrintStr( vStr, pBuffer );
}